

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btBox2dBox2dCollisionAlgorithm::processCollision
          (btBox2dBox2dCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btBox2dShape *polyA;
  btBox2dShape *polyB;
  btPersistentManifold *this_00;
  btCollisionObject *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionObject *pbVar3;
  
  if (this->m_manifoldPtr != (btPersistentManifold *)0x0) {
    polyA = (btBox2dShape *)body0Wrap->m_shape;
    polyB = (btBox2dShape *)body1Wrap->m_shape;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    b2CollidePolygons(resultOut,polyA,body0Wrap->m_worldTransform,polyB,body1Wrap->m_worldTransform)
    ;
    if ((this->m_ownManifold == true) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pbVar1 = resultOut->m_body0Wrap->m_collisionObject;
      pbVar2 = resultOut->m_body1Wrap->m_collisionObject;
      pbVar3 = pbVar2;
      if (this_00->m_body0 == pbVar1) {
        pbVar3 = pbVar1;
        pbVar1 = pbVar2;
      }
      btPersistentManifold::refreshContactPoints
                (this_00,&pbVar3->m_worldTransform,&pbVar1->m_worldTransform);
      return;
    }
  }
  return;
}

Assistant:

void btBox2dBox2dCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	
	const btBox2dShape* box0 = (const btBox2dShape*)body0Wrap->getCollisionShape();
	const btBox2dShape* box1 = (const btBox2dShape*)body1Wrap->getCollisionShape();

	resultOut->setPersistentManifold(m_manifoldPtr);

	b2CollidePolygons(resultOut,box0,body0Wrap->getWorldTransform(),box1,body1Wrap->getWorldTransform());

	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}

}